

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O0

void zswap(int n,complex<double> *cx,int incx,complex<double> *cy,int incy)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int local_4c;
  int local_48;
  int iy;
  int ix;
  int i;
  complex<double> ctemp;
  int incy_local;
  complex<double> *cy_local;
  int incx_local;
  complex<double> *cx_local;
  int n_local;
  
  ctemp._M_value._12_4_ = incy;
  std::complex<double>::complex((complex<double> *)&ix,0.0,0.0);
  if (0 < n) {
    if ((incx == 1) && (ctemp._M_value._12_4_ == 1)) {
      for (iy = 0; iy < n; iy = iy + 1) {
        uVar1 = *(undefined8 *)cx[iy]._M_value;
        uVar2 = *(undefined8 *)(cx[iy]._M_value + 8);
        *(undefined8 *)cx[iy]._M_value = *(undefined8 *)cy[iy]._M_value;
        *(undefined8 *)(cx[iy]._M_value + 8) = *(undefined8 *)(cy[iy]._M_value + 8);
        *(undefined8 *)cy[iy]._M_value = uVar1;
        *(undefined8 *)(cy[iy]._M_value + 8) = uVar2;
      }
    }
    else {
      if (incx < 0) {
        local_48 = (1 - n) * incx;
      }
      else {
        local_48 = 0;
      }
      if ((int)ctemp._M_value._12_4_ < 0) {
        local_4c = (1 - n) * ctemp._M_value._12_4_;
      }
      else {
        local_4c = 0;
      }
      for (iy = 0; iy < n; iy = iy + 1) {
        uVar1 = *(undefined8 *)cx[local_48]._M_value;
        uVar2 = *(undefined8 *)(cx[local_48]._M_value + 8);
        *(undefined8 *)cx[local_48]._M_value = *(undefined8 *)cy[local_4c]._M_value;
        *(undefined8 *)(cx[local_48]._M_value + 8) = *(undefined8 *)(cy[local_4c]._M_value + 8);
        *(undefined8 *)cy[local_4c]._M_value = uVar1;
        *(undefined8 *)(cy[local_4c]._M_value + 8) = uVar2;
        local_48 = local_48 + incx;
        local_4c = local_4c + ctemp._M_value._12_4_;
      }
    }
  }
  return;
}

Assistant:

void zswap ( int n, complex <double> cx[], int incx, complex <double> cy[],
  int incy )

//****************************************************************************80
//
//  Purpose:
//
//    ZSWAP interchanges two complex <double> vectors.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input/output, complex <double> CX[], one of the vectors to swap.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Input/output, complex <double> CY[], one of the vectors to swap.
//
//    Input, int INCY, the increment between successive elements of CY.
//
{
  complex <double> ctemp;
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      ctemp = cx[i];
      cx[i] = cy[i];
      cy[i] = ctemp;
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      ctemp = cx[ix];
      cx[ix] = cy[iy];
      cy[iy] = ctemp;
      ix = ix + incx;
      iy = iy + incy;
    }
  }

  return;
}